

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O2

void comp_func_solid_Source_rgbafp_avx2
               (QRgbaFloat32 *dst,int length,QRgbaFloat32 color,uint const_alpha)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  long lVar6;
  float fVar7;
  float fVar9;
  float fVar10;
  undefined1 auVar8 [64];
  float fVar11;
  undefined1 auVar12 [64];
  float fVar13;
  
  auVar12._8_56_ = color._16_56_;
  auVar12._0_8_ = color._8_8_;
  auVar8._8_56_ = color._8_56_;
  auVar8._0_8_ = color._0_8_;
  auVar1 = vmovlhps_avx(auVar8._0_16_,auVar12._0_16_);
  if (const_alpha == 0xff) {
    for (lVar6 = 0; (ulong)(uint)(~(length >> 0x1f) & length) << 4 != lVar6; lVar6 = lVar6 + 0x10) {
      *(undefined1 (*) [16])((long)&dst->r + lVar6) = auVar1;
    }
  }
  else {
    fVar11 = (float)const_alpha / 255.0;
    fVar13 = 0.0;
    fVar2 = 1.0 - fVar11;
    fVar7 = auVar1._0_4_ * fVar11;
    fVar9 = auVar1._4_4_ * fVar11;
    fVar10 = auVar1._8_4_ * fVar11;
    fVar11 = auVar1._12_4_ * fVar11;
    for (lVar6 = 0; lVar6 < length + -1; lVar6 = lVar6 + 2) {
      fVar3 = dst[1].r;
      fVar4 = dst[1].g;
      fVar5 = dst[1].b;
      fVar13 = fVar11 + fVar13;
      dst->r = fVar7 + fVar2 * dst->r;
      dst->g = fVar9 + fVar2 * dst->g;
      dst->b = fVar10 + fVar2 * dst->b;
      dst->a = fVar11 + fVar2 * dst->a;
      dst[1].r = fVar7 + fVar2 * fVar3;
      dst[1].g = fVar9 + fVar2 * fVar4;
      dst[1].b = fVar10 + fVar2 * fVar5;
      dst[1].a = fVar13;
      dst = dst + 2;
    }
    if ((int)lVar6 < length) {
      dst->r = fVar7 + fVar2 * dst->r;
      dst->g = fVar9 + fVar2 * dst->g;
      dst->b = fVar10 + fVar2 * dst->b;
      dst->a = fVar11 + fVar2 * dst->a;
    }
  }
  return;
}

Assistant:

void QT_FASTCALL comp_func_solid_Source_rgbafp_avx2(QRgbaFloat32 *dst, int length, QRgbaFloat32 color, uint const_alpha)
{
    Q_ASSERT(const_alpha < 256); // const_alpha is in [0-255]
    if (const_alpha == 255) {
        for (int i = 0; i < length; ++i)
            dst[i] = color;
    } else {
        const float a = const_alpha / 255.0f;
        const __m128 alphaVector = _mm_set1_ps(a);
        const __m128 minusAlphaVector = _mm_set1_ps(1.0f - a);
        __m128 colorVector = _mm_loadu_ps((const float *)&color);
        colorVector = _mm_mul_ps(colorVector, alphaVector);
        const __m256 colorVector256 = _mm256_insertf128_ps(_mm256_castps128_ps256(colorVector), colorVector, 1);
        const __m256 minusAlphaVector256 = _mm256_set1_ps(1.0f - a);
        int x = 0;
        for (; x < length - 1; x += 2) {
            __m256 dstVector = _mm256_loadu_ps((const float *)&dst[x]);
            dstVector = _mm256_mul_ps(dstVector, minusAlphaVector256);
            dstVector = _mm256_add_ps(dstVector, colorVector256);
            _mm256_storeu_ps((float *)&dst[x], dstVector);
        }
        if (x < length) {
            __m128 dstVector = _mm_loadu_ps((const float *)&dst[x]);
            dstVector = _mm_mul_ps(dstVector, minusAlphaVector);
            dstVector = _mm_add_ps(dstVector, colorVector);
            _mm_storeu_ps((float *)&dst[x], dstVector);
        }
    }
}